

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarReader.cpp
# Opt level: O0

Pair * ZXing::OneD::ReadPair(PatternView *view,bool rightPair)

{
  bool bVar1;
  value_type vVar2;
  value_type vVar3;
  int iVar4;
  int iVar5;
  byte in_DL;
  PatternView *in_RSI;
  Pair *in_RDI;
  int xStop;
  int xStart;
  Character inside;
  bool in_stack_00000056;
  bool in_stack_00000057;
  PatternView *in_stack_00000058;
  Character outside;
  int pattern;
  bool in_stack_000000ff;
  PatternView *in_stack_00000100;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  Character local_60 [5];
  Character local_38 [5];
  int local_10;
  byte local_9;
  PatternView *local_8;
  
  local_9 = in_DL & 1;
  local_8 = in_RSI;
  DataBar::Finder((PatternView *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  local_10 = ParseFinderPattern(in_stack_00000100,in_stack_000000ff);
  if (local_10 != 0) {
    if ((local_9 & 1) == 0) {
      DataBar::LeftChar((PatternView *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                       );
    }
    else {
      DataBar::RightChar((PatternView *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    }
    local_38[0] = ReadDataCharacter(in_stack_00000058,in_stack_00000057,in_stack_00000056);
    bVar1 = DataBar::Character::operator_cast_to_bool(local_38);
    if (bVar1) {
      if ((local_9 & 1) == 0) {
        DataBar::RightChar((PatternView *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      }
      else {
        DataBar::LeftChar((PatternView *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      }
      local_60[0] = ReadDataCharacter(in_stack_00000058,in_stack_00000057,in_stack_00000056);
      bVar1 = DataBar::Character::operator_cast_to_bool(local_60);
      if (bVar1) {
        iVar4 = PatternView::pixelsInFront
                          ((PatternView *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        vVar2 = PatternView::operator[](local_8,-1);
        iVar5 = PatternView::pixelsTillEnd((PatternView *)CONCAT44(in_stack_ffffffffffffff64,iVar4))
        ;
        vVar3 = PatternView::operator[](local_8,0x15);
        in_RDI->left = local_38[0];
        in_RDI->right = local_60[0];
        in_RDI->finder = local_10;
        in_RDI->xStart = iVar4 - (uint)vVar2;
        in_RDI->xStop = iVar5 + (uint)vVar3 * 2;
        in_RDI->y = -1;
        in_RDI->count = 1;
        return in_RDI;
      }
    }
  }
  (in_RDI->left).value = -1;
  (in_RDI->left).checksum = 0;
  (in_RDI->right).value = -1;
  (in_RDI->right).checksum = 0;
  in_RDI->finder = 0;
  in_RDI->xStart = -1;
  in_RDI->xStop = 1;
  in_RDI->y = -1;
  in_RDI->count = 1;
  return in_RDI;
}

Assistant:

static Pair ReadPair(const PatternView& view, bool rightPair)
{
	if (int pattern = ParseFinderPattern(Finder(view), rightPair))
		if (auto outside = ReadDataCharacter(rightPair ? RightChar(view) : LeftChar(view), true, rightPair))
			if (auto inside = ReadDataCharacter(rightPair ? LeftChar(view) : RightChar(view), false, rightPair)) {
				// include left and right guards
				int xStart = view.pixelsInFront() - view[-1];
				int xStop  = view.pixelsTillEnd() + 2 * view[FULL_PAIR_SIZE];
				return {outside, inside, pattern, xStart, xStop};
			}

	return {};
}